

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mioUtils.c
# Opt level: O1

int Mio_DelayCompare(Mio_Gate_t **ppG1,Mio_Gate_t **ppG2)

{
  double dVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  
  dVar1 = (*ppG1)->dDelayMax;
  dVar2 = (*ppG2)->dDelayMax;
  iVar4 = -1;
  if (dVar2 + -0.009463599883019924 <= dVar1) {
    if (dVar1 <= dVar2 + 0.009463599883019924) {
      iVar3 = strcmp((*ppG1)->pName,(*ppG2)->pName);
      if ((-1 < iVar3) && (iVar4 = 1, iVar3 == 0)) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mio/mioUtils.c"
                      ,0x197,"int Mio_DelayCompare(Mio_Gate_t **, Mio_Gate_t **)");
      }
    }
    else {
      iVar4 = 1;
    }
  }
  return iVar4;
}

Assistant:

int Mio_DelayCompare( Mio_Gate_t ** ppG1, Mio_Gate_t ** ppG2 )
{
    int Comp;
    float Eps = (float)0.0094636;
    if ( (*ppG1)->dDelayMax < (*ppG2)->dDelayMax - Eps )
        return -1;
    if ( (*ppG1)->dDelayMax > (*ppG2)->dDelayMax + Eps )
        return 1;
    // compare names
    Comp = strcmp( (*ppG1)->pName, (*ppG2)->pName );
    if ( Comp < 0 )
        return -1;
    if ( Comp > 0 )
        return 1;
    assert( 0 );
    return 0;
}